

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O2

size_t __thiscall CVmFile::read_str_byte_prefix(CVmFile *this,char *buf,size_t buflen)

{
  byte bVar1;
  ulong buflen_00;
  
  bVar1 = read_byte(this);
  buflen_00 = (ulong)bVar1;
  if (buflen_00 < buflen) {
    read_bytes(this,buf,buflen_00);
    buf[buflen_00] = '\0';
    return buflen_00;
  }
  err_throw(0x65);
}

Assistant:

size_t read_str_byte_prefix(char *buf, size_t buflen)
    {
        size_t len = read_byte();
        if (len+1 > buflen)
            err_throw(VMERR_READ_FILE);

        read_bytes(buf, len);
        buf[len] = '\0';
        return len;
    }